

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

Config * jaegertracing::samplers::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  int maxOperations_00;
  bool bVar1;
  char (*in_R8) [1];
  double param_00;
  duration local_f0;
  int local_e8;
  int local_e4;
  duration<long,_std::ratio<1L,_1L>_> local_e0;
  seconds samplingRefreshInterval;
  undefined1 local_d0 [4];
  int maxOperations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> samplingServerURL;
  double param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Node *local_18;
  Node *configYAML_local;
  
  local_18 = configYAML;
  configYAML_local = (Node *)__return_storage_ptr__;
  bVar1 = YAML::Node::IsDefined(configYAML);
  if ((bVar1) && (bVar1 = YAML::Node::IsMap(local_18), bVar1)) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[5],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&param,
               (yaml *)local_18,(Node *)0x46ad9a,(char (*) [5])0x469ba4,in_R8);
    samplingServerURL.field_2._12_4_ = 0xffffffff;
    param_00 = utils::yaml::findOrDefault<double,char[6],int>
                         (local_18,(char (*) [6])0x462bfe,
                          (int *)(samplingServerURL.field_2._M_local_buf + 0xc));
    utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               (yaml *)local_18,(Node *)"samplingServerURL",(char (*) [18])0x469ba4,in_R8);
    samplingRefreshInterval.__r._0_4_ = 0;
    samplingRefreshInterval.__r._4_4_ =
         utils::yaml::findOrDefault<int,char[14],int>
                   (local_18,(char (*) [14])"maxOperations",(int *)&samplingRefreshInterval);
    local_e8 = 0;
    local_e4 = utils::yaml::findOrDefault<int,char[24],int>
                         (local_18,(char (*) [24])"samplingRefreshInterval",&local_e8);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_e0,&local_e4);
    maxOperations_00 = samplingRefreshInterval.__r._4_4_;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_f0,&local_e0);
    Config(__return_storage_ptr__,(string *)&param,param_00,(string *)local_d0,maxOperations_00,
           &local_f0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&param);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"remote",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"http://127.0.0.1:5778/sampling",&local_71);
    type.field_2._8_8_ = defaultSamplingRefreshInterval();
    Config(__return_storage_ptr__,&local_38,0.001,&local_70,2000,
           (duration *)((long)&type.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto type =
            utils::yaml::findOrDefault<std::string>(configYAML, "type", "");
        const auto param =
            utils::yaml::findOrDefault<double>(configYAML, "param", -1);
        const auto samplingServerURL = utils::yaml::findOrDefault<std::string>(
            configYAML, "samplingServerURL", "");
        const auto maxOperations =
            utils::yaml::findOrDefault<int>(configYAML, "maxOperations", 0);
        const auto samplingRefreshInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "samplingRefreshInterval", 0));
        return Config(type,
                      param,
                      samplingServerURL,
                      maxOperations,
                      samplingRefreshInterval);
    }